

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.cpp
# Opt level: O3

void __thiscall IZDeflate::build_tree(IZDeflate *this,tree_desc *desc)

{
  int iVar1;
  int iVar2;
  ct_data *tree;
  ct_data *pcVar3;
  bool bVar4;
  int iVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  
  tree = desc->dyn_tree;
  pcVar3 = desc->static_tree;
  uVar12 = (ulong)desc->elems;
  this->heap_len = 0;
  this->heap_max = 0x23d;
  uVar10 = 0xffffffff;
  if ((long)uVar12 < 1) {
    uVar11 = 0;
  }
  else {
    uVar8 = 0;
    do {
      if (tree[uVar8].fc.freq == 0) {
        tree[uVar8].dl.dad = 0;
      }
      else {
        iVar9 = this->heap_len;
        this->heap_len = iVar9 + 1;
        this->heap[(long)iVar9 + 1] = (int)uVar8;
        this->depth[uVar8] = '\0';
        uVar10 = uVar8 & 0xffffffff;
      }
      iVar9 = (int)uVar10;
      uVar8 = uVar8 + 1;
    } while (uVar12 != uVar8);
    uVar11 = this->heap_len;
    if (1 < (int)uVar11) goto LAB_00127e83;
  }
  do {
    uVar7 = (int)uVar10 + 1;
    if ((int)uVar10 < 2) {
      uVar10 = (ulong)uVar7;
    }
    else {
      uVar7 = 0;
    }
    iVar9 = (int)uVar10;
    this->heap_len = uVar11 + 1;
    this->heap[(long)(int)uVar11 + 1] = uVar7;
    tree[(int)uVar7].fc.freq = 1;
    this->depth[(int)uVar7] = '\0';
    this->opt_len = this->opt_len - 1;
    if (pcVar3 != (ct_data *)0x0) {
      this->static_len = this->static_len - (ulong)pcVar3[(int)uVar7].dl.dad;
    }
    uVar11 = this->heap_len;
  } while ((int)uVar11 < 2);
LAB_00127e83:
  desc->max_code = iVar9;
  uVar11 = uVar11 >> 1;
  do {
    pqdownheap(this,tree,uVar11);
    bVar4 = 1 < uVar11;
    uVar11 = uVar11 - 1;
  } while (bVar4);
  iVar5 = this->heap_len;
  do {
    iVar1 = this->heap[1];
    this->heap_len = iVar5 + -1;
    this->heap[1] = this->heap[iVar5];
    pqdownheap(this,tree,1);
    iVar5 = this->heap[1];
    iVar2 = this->heap_max;
    this->heap_max = iVar2 + -1;
    this->heap[(long)iVar2 + -1] = iVar1;
    iVar2 = this->heap_max;
    this->heap_max = iVar2 + -1;
    this->heap[(long)iVar2 + -1] = iVar5;
    tree[uVar12].fc.freq = tree[iVar5].fc.freq + tree[iVar1].fc.freq;
    bVar6 = this->depth[iVar5];
    if (this->depth[iVar5] < this->depth[iVar1]) {
      bVar6 = this->depth[iVar1];
    }
    this->depth[uVar12] = bVar6 + 1;
    tree[iVar5].dl.dad = (ush)uVar12;
    tree[iVar1].dl.dad = (ush)uVar12;
    this->heap[1] = (int)uVar12;
    pqdownheap(this,tree,1);
    iVar5 = this->heap_len;
    uVar12 = uVar12 + 1;
  } while (1 < iVar5);
  iVar5 = this->heap[1];
  iVar1 = this->heap_max;
  this->heap_max = iVar1 + -1;
  this->heap[(long)iVar1 + -1] = iVar5;
  gen_bitlen(this,desc);
  gen_codes(this,tree,iVar9);
  return;
}

Assistant:

void IZDeflate::build_tree(tree_desc near *desc)
    // tree_desc near *desc; /* the tree descriptor */
{
    ct_data near *tree   = desc->dyn_tree;
    ct_data near *stree  = desc->static_tree;
    int elems            = desc->elems;
    int n, m;          /* iterate over heap elements */
    int max_code = -1; /* largest code with non zero frequency */
    int node = elems;  /* next internal node of the tree */

    /* Construct the initial heap, with least frequent element in
     * heap[SMALLEST]. The sons of heap[n] are heap[2*n] and heap[2*n+1].
     * heap[0] is not used.
     */
    heap_len = 0, heap_max = HEAP_SIZE;

    for (n = 0; n < elems; n++) {
        if (tree[n].Freq != 0) {
            heap[++heap_len] = max_code = n;
            depth[n] = 0;
        } else {
            tree[n].Len = 0;
        }
    }

    /* The pkzip format requires that at least one distance code exists,
     * and that at least one bit should be sent even if there is only one
     * possible code. So to avoid special checks later on we force at least
     * two codes of non zero frequency.
     */
    while (heap_len < 2) {
        int newv = heap[++heap_len] = (max_code < 2 ? ++max_code : 0);
        tree[newv].Freq = 1;
        depth[newv] = 0;
        opt_len--; if (stree) static_len -= stree[newv].Len;
        /* newv is 0 or 1 so it does not have extra bits */
    }
    desc->max_code = max_code;

    /* The elements heap[heap_len/2+1 .. heap_len] are leaves of the tree,
     * establish sub-heaps of increasing lengths:
     */
    for (n = heap_len/2; n >= 1; n--) pqdownheap(tree, n);

    /* Construct the Huffman tree by repeatedly combining the least two
     * frequent nodes.
     */
    do {
        pqremove(tree, n);   /* n = node of least frequency */
        m = heap[SMALLEST];  /* m = node of next least frequency */

        heap[--heap_max] = n; /* keep the nodes sorted by frequency */
        heap[--heap_max] = m;

        /* Create a new node father of n and m */
        tree[node].Freq = (ush)(tree[n].Freq + tree[m].Freq);
        depth[node] = (uch) (Max(depth[n], depth[m]) + 1);
        tree[n].Dad = tree[m].Dad = (ush)node;
#ifdef DUMP_BL_TREE
        if (tree == bl_tree) {
            fprintf(mesg,"\nnode %d(%d), sons %d(%d) %d(%d)",
                    node, tree[node].Freq, n, tree[n].Freq, m, tree[m].Freq);
        }
#endif
        /* and insert the new node in the heap */
        heap[SMALLEST] = node++;
        pqdownheap(tree, SMALLEST);

    } while (heap_len >= 2);

    heap[--heap_max] = heap[SMALLEST];

    /* At this point, the fields freq and dad are set. We can now
     * generate the bit lengths.
     */
    gen_bitlen((tree_desc near *)desc);

    /* The field len is now set, we can generate the bit codes */
    gen_codes ((ct_data near *)tree, max_code);
}